

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_tar.c
# Opt level: O3

void pax_time(char *p,int64_t *ps,long *pn)

{
  char cVar1;
  bool bVar2;
  ulong uVar3;
  char cVar4;
  long lVar5;
  long lVar6;
  char *pcVar7;
  
  cVar1 = *p;
  pcVar7 = p + (cVar1 == '-');
  cVar4 = p[cVar1 == '-'];
  if ((byte)(cVar4 - 0x30U) < 10) {
    lVar6 = 0;
    do {
      if ((0xccccccccccccccc < lVar6) || (lVar6 == 0xccccccccccccccc && 7 < (byte)(cVar4 - 0x30U)))
      {
        lVar6 = 0x7fffffffffffffff;
        break;
      }
      lVar6 = (ulong)(byte)(cVar4 - 0x30U) + lVar6 * 10;
      cVar4 = pcVar7[1];
      pcVar7 = pcVar7 + 1;
    } while ((byte)(cVar4 - 0x30U) < 10);
  }
  else {
    lVar6 = 0;
  }
  lVar5 = -lVar6;
  if (cVar1 != '-') {
    lVar5 = lVar6;
  }
  *ps = lVar5;
  *pn = 0;
  if (*pcVar7 == '.') {
    lVar6 = 0;
    uVar3 = 100000000;
    do {
      pcVar7 = pcVar7 + 1;
      if (9 < (byte)(*pcVar7 - 0x30U)) {
        return;
      }
      lVar6 = lVar6 + (byte)(*pcVar7 - 0x30U) * uVar3;
      *pn = lVar6;
      bVar2 = 9 < uVar3;
      uVar3 = uVar3 / 10;
    } while (bVar2);
  }
  return;
}

Assistant:

static void
pax_time(const char *p, int64_t *ps, long *pn)
{
	char digit;
	int64_t	s;
	unsigned long l;
	int sign;
	int64_t limit, last_digit_limit;

	limit = INT64_MAX / 10;
	last_digit_limit = INT64_MAX % 10;

	s = 0;
	sign = 1;
	if (*p == '-') {
		sign = -1;
		p++;
	}
	while (*p >= '0' && *p <= '9') {
		digit = *p - '0';
		if (s > limit ||
		    (s == limit && digit > last_digit_limit)) {
			s = INT64_MAX;
			break;
		}
		s = (s * 10) + digit;
		++p;
	}

	*ps = s * sign;

	/* Calculate nanoseconds. */
	*pn = 0;

	if (*p != '.')
		return;

	l = 100000000UL;
	do {
		++p;
		if (*p >= '0' && *p <= '9')
			*pn += (*p - '0') * l;
		else
			break;
	} while (l /= 10);
}